

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

void __thiscall soul::Optimisations::Inliner::~Inliner(Inliner *this)

{
  Inliner *this_local;
  
  pool_ptr<soul::heart::Variable>::~pool_ptr(&this->returnValueVar);
  pool_ptr<soul::heart::Block>::~pool_ptr(&this->postCallResumeBlock);
  std::
  unordered_map<soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>_>
  ::~unordered_map(&this->remappedVariables);
  std::
  unordered_map<soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>_>
  ::~unordered_map(&this->remappedBlocks);
  std::
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>::
  ~vector(&this->newBlocks);
  std::__cxx11::string::~string((string *)&this->inlinedFnName);
  return;
}

Assistant:

Inliner (Module& m, heart::Function& parentFn, size_t block,
                 heart::FunctionCall& fc, heart::Function& targetFn)
            : module (m), parentFunction (parentFn), call (fc), blockIndex (block), targetFunction (targetFn)
        {
            inlinedFnName = addSuffixToMakeUnique ("_inlined_" + targetFunction.name.toString(),
                                                   [&] (const std::string& nm)
                                                   {
                                                       return heart::Utilities::findBlock (parentFn, "@" + nm) != nullptr;
                                                   });
        }